

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_explain.c
# Opt level: O2

void print_usage(char *progname)

{
  fprintf(_stderr,"Usage: %s [-pa] version\n",progname);
  fputc(10,_stderr);
  fwrite(" -p       - \'p\' letter is treated as \'patch\' instead of \'pre\'\n",0x3e,1,_stderr);
  fwrite(" -a       - any alphabetic characters are treated as post-release\n",0x42,1,_stderr);
  fputc(10,_stderr);
  fwrite(" -h, -?   - print usage and exit\n",0x21,1,_stderr);
  fwrite(" -v       - print version and exit\n",0x23,1,_stderr);
  return;
}

Assistant:

static void print_usage(const char* progname) {
	fprintf(stderr, "Usage: %s [-pa] version\n", progname);
	fprintf(stderr, "\n");
	fprintf(stderr, " -p       - 'p' letter is treated as 'patch' instead of 'pre'\n");
	fprintf(stderr, " -a       - any alphabetic characters are treated as post-release\n");
	fprintf(stderr, "\n");
	fprintf(stderr, " -h, -?   - print usage and exit\n");
	fprintf(stderr, " -v       - print version and exit\n");
}